

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

cTValue * str2num(cTValue *o,TValue *n)

{
  int iVar1;
  TValue *in_RSI;
  cTValue *in_RDI;
  cTValue *local_8;
  
  local_8 = in_RDI;
  if ((0xfffefffe < (in_RDI->field_2).it) &&
     (((in_RDI->field_2).it != 0xfffffffb ||
      (iVar1 = lj_strscan_num((GCstr *)&in_RDI->field_2,in_RSI), local_8 = in_RSI, iVar1 == 0)))) {
    local_8 = (cTValue *)0x0;
  }
  return local_8;
}

Assistant:

static cTValue *str2num(cTValue *o, TValue *n)
{
  if (tvisnum(o))
    return o;
  else if (tvisint(o))
    return (setnumV(n, (lua_Number)intV(o)), n);
  else if (tvisstr(o) && lj_strscan_num(strV(o), n))
    return n;
  else
    return NULL;
}